

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O1

int clause2_create_new(sat_solver2 *s,lit *begin,lit *end,int learnt,int proof_id)

{
  ABC_INT64_T *pAVar1;
  veci *pvVar2;
  int *piVar3;
  veci *pvVar4;
  int iVar5;
  int **ppiVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  size_t __size;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint *puVar16;
  uint uVar17;
  bool bVar18;
  
  iVar11 = (int)((ulong)((long)end - (long)begin) >> 2);
  if ((0 < iVar11) && (*begin < 0)) {
    __assert_fail("size < 1 || begin[0] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                  ,0x19c,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
  }
  if ((1 < iVar11) && (begin[1] < 0)) {
    __assert_fail("size < 2 || begin[1] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                  ,0x19d,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
  }
  if ((0 < iVar11) && (s->size <= *begin >> 1)) {
    __assert_fail("size < 1 || lit_var(begin[0]) < s->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                  ,0x19e,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
  }
  if ((1 < iVar11) && (s->size <= begin[1] >> 1)) {
    __assert_fail("size < 2 || lit_var(begin[1]) < s->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                  ,0x19f,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
  }
  uVar17 = iVar11 + 3U & 0xfffffffe;
  iVar9 = 1 << ((byte)(s->Mem).nPageSize & 0x1f);
  if (iVar9 <= (int)(uVar17 + 3)) {
    __assert_fail("nInts + 3 < (1 << p->nPageSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satClause.h"
                  ,0x132,"int Sat_MemAppend(Sat_Mem_t *, int *, int, int, int)");
  }
  ppiVar6 = (s->Mem).pPages;
  iVar5 = (s->Mem).iPage[(uint)learnt];
  piVar7 = ppiVar6[iVar5];
  if (iVar9 <= (int)(*piVar7 + uVar17 + 2)) {
    iVar5 = iVar5 + 2;
    (s->Mem).iPage[(uint)learnt] = iVar5;
    iVar9 = (s->Mem).nPagesAlloc;
    if (iVar9 <= iVar5) {
      __size = (long)iVar9 << 4;
      if (ppiVar6 == (int **)0x0) {
        ppiVar6 = (int **)malloc(__size);
      }
      else {
        ppiVar6 = (int **)realloc(ppiVar6,__size);
      }
      (s->Mem).pPages = ppiVar6;
      iVar9 = (s->Mem).nPagesAlloc;
      memset(ppiVar6 + iVar9,0,(long)iVar9 << 3);
      (s->Mem).nPagesAlloc = iVar9 * 2;
    }
    ppiVar6 = (s->Mem).pPages;
    iVar9 = (s->Mem).iPage[(uint)learnt];
    if (ppiVar6[iVar9] == (int *)0x0) {
      piVar7 = (int *)malloc((long)(1 << ((byte)(s->Mem).nPageSize & 0x1f)) << 2);
      ppiVar6[iVar9] = piVar7;
    }
    piVar7 = (s->Mem).pPages[iVar9];
    *piVar7 = 2;
  }
  piVar7[*piVar7] = 0;
  puVar16 = (uint *)(piVar7 + *piVar7);
  *puVar16 = learnt & 1U | *puVar16 & 0x7fe | iVar11 << 0xb;
  if (begin != (lit *)0x0) {
    memcpy(puVar16 + 1,begin,((long)end - (long)begin) * 0x40000000 >> 0x1e & 0xfffffffffffffffc);
  }
  puVar16[(ulong)(*puVar16 >> 0xb) + 1] = (s->Mem).nEntries[(uint)learnt];
  piVar3 = (s->Mem).nEntries + (uint)learnt;
  *piVar3 = *piVar3 + 1;
  *piVar7 = *piVar7 + uVar17;
  iVar9 = (s->Mem).iPage[(uint)learnt];
  uVar10 = iVar9 << ((byte)(s->Mem).nPageSize & 0x1f) | *(s->Mem).pPages[iVar9];
  if ((uVar10 & 1) != 0) {
    __assert_fail("!(h & 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                  ,0x1a2,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
  }
  uVar10 = uVar10 - uVar17;
  if (uVar10 == 0) {
    puVar16 = (uint *)0x0;
  }
  else {
    uVar17 = (s->Mem).uPageMask & uVar10;
    if (uVar17 == 0) {
      __assert_fail("k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satClause.h"
                    ,0x60,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
    }
    puVar16 = (uint *)((s->Mem).pPages[(int)uVar10 >> ((byte)(s->Mem).nPageSize & 0x1f)] +
                      (int)uVar17);
  }
  if (learnt == 0) {
    uVar17 = (s->stats).clauses;
    if (puVar16[(ulong)(*puVar16 >> 0xb) + 1] != uVar17) {
      __assert_fail("clause_id(c) == (int)s->stats.clauses",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                    ,0x1b7,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
    }
    (s->stats).clauses = uVar17 + 1;
    pAVar1 = &(s->stats).clauses_literals;
    *pAVar1 = *pAVar1 + (long)iVar11;
  }
  else {
    if ((proof_id == 0) && (s->pPrf1 != (Vec_Set_t *)0x0)) {
      __assert_fail("proof_id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                    ,0x1a7,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
    }
    uVar17 = *puVar16;
    uVar13 = 0;
    if (0x7ff < uVar17) {
      uVar12 = 0;
      uVar13 = 0;
      uVar14 = 0;
      do {
        uVar15 = 1 << ((byte)s->levels[(int)puVar16[uVar12 + 1] >> 1] & 0x1f);
        bVar18 = (uVar14 >> (s->levels[(int)puVar16[uVar12 + 1] >> 1] & 0x1fU) & 1) != 0;
        if (bVar18) {
          uVar15 = 0;
        }
        uVar13 = (uVar13 + 1) - (uint)bVar18;
        uVar14 = uVar14 | uVar15;
        uVar12 = uVar12 + 1;
      } while (uVar17 >> 0xb != uVar12);
      uVar13 = (uVar13 & 0xff) << 3;
    }
    *puVar16 = uVar17 & 0xfffff807 | uVar13;
    if (puVar16[(ulong)(uVar17 >> 0xb) + 1] != (s->act_clas).size) {
      __assert_fail("clause_id(c) == veci_size(&s->act_clas)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                    ,0x1a9,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
    }
    if ((s->pPrf1 != (Vec_Set_t *)0x0) || (s->pInt2 != (Int2_Man_t *)0x0)) {
      uVar17 = (s->claProofs).cap;
      if ((s->claProofs).size == uVar17) {
        iVar9 = (uVar17 >> 1) * 3;
        if ((int)uVar17 < 4) {
          iVar9 = uVar17 * 2;
        }
        piVar7 = (s->claProofs).ptr;
        if (piVar7 == (int *)0x0) {
          piVar7 = (int *)malloc((long)iVar9 << 2);
        }
        else {
          piVar7 = (int *)realloc(piVar7,(long)iVar9 << 2);
        }
        (s->claProofs).ptr = piVar7;
        if (piVar7 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->claProofs).cap * 9.5367431640625e-07,
                 (double)iVar9 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->claProofs).cap = iVar9;
      }
      iVar9 = (s->claProofs).size;
      (s->claProofs).size = iVar9 + 1;
      (s->claProofs).ptr[iVar9] = proof_id;
    }
    uVar17 = (s->act_clas).cap;
    if ((s->act_clas).size == uVar17) {
      iVar9 = (uVar17 >> 1) * 3;
      if ((int)uVar17 < 4) {
        iVar9 = uVar17 * 2;
      }
      piVar7 = (s->act_clas).ptr;
      if (piVar7 == (int *)0x0) {
        piVar7 = (int *)malloc((long)iVar9 << 2);
      }
      else {
        piVar7 = (int *)realloc(piVar7,(long)iVar9 << 2);
      }
      (s->act_clas).ptr = piVar7;
      if (piVar7 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->act_clas).cap * 9.5367431640625e-07,(double)iVar9 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      (s->act_clas).cap = iVar9;
    }
    iVar9 = (s->act_clas).size;
    (s->act_clas).size = iVar9 + 1;
    (s->act_clas).ptr[iVar9] = 0;
    if (2 < iVar11) {
      uVar17 = puVar16[(ulong)(*puVar16 >> 0xb) + 1];
      if (((long)(int)uVar17 < 0) || ((s->act_clas).size <= (int)uVar17)) {
        __assert_fail("Id >= 0 && Id < veci_size(&s->act_clas)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                      ,0x17e,"void act_clause2_bump(sat_solver2 *, clause *)");
      }
      piVar3 = (s->act_clas).ptr;
      piVar7 = piVar3 + (int)uVar17;
      *piVar7 = *piVar7 + s->cla_inc;
      if (*piVar7 < 0) {
        if (0 < (s->act_clas).size) {
          lVar8 = 0;
          do {
            puVar16 = (uint *)(piVar3 + lVar8);
            *puVar16 = *puVar16 >> 0xe;
            lVar8 = lVar8 + 1;
          } while (lVar8 < (s->act_clas).size);
        }
        iVar5 = s->cla_inc >> 0xe;
        iVar9 = 0x400;
        if (0x400 < iVar5) {
          iVar9 = iVar5;
        }
        s->cla_inc = iVar9;
      }
    }
    puVar16 = &(s->stats).learnts;
    *puVar16 = *puVar16 + 1;
    pAVar1 = &(s->stats).learnts_literals;
    *pAVar1 = *pAVar1 + (long)iVar11;
    s->hLearntLast = uVar10;
  }
  if (1 < iVar11) {
    uVar12 = (long)*begin ^ 1;
    pvVar4 = s->wlists;
    pvVar2 = pvVar4 + uVar12;
    uVar17 = pvVar4[uVar12].cap;
    if (pvVar4[uVar12].size == uVar17) {
      iVar11 = (uVar17 >> 1) * 3;
      if ((int)uVar17 < 4) {
        iVar11 = uVar17 * 2;
      }
      if (pvVar2->ptr == (int *)0x0) {
        piVar7 = (int *)malloc((long)iVar11 << 2);
      }
      else {
        piVar7 = (int *)realloc(pvVar2->ptr,(long)iVar11 << 2);
      }
      pvVar2->ptr = piVar7;
      if (piVar7 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)pvVar2->cap * 9.5367431640625e-07,(double)iVar11 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      pvVar2->cap = iVar11;
    }
    iVar11 = pvVar2->size;
    pvVar2->size = iVar11 + 1;
    pvVar2->ptr[iVar11] = uVar10;
    uVar12 = (long)begin[1] ^ 1;
    pvVar4 = s->wlists;
    pvVar2 = pvVar4 + uVar12;
    uVar17 = pvVar4[uVar12].cap;
    if (pvVar4[uVar12].size == uVar17) {
      iVar11 = (uVar17 >> 1) * 3;
      if ((int)uVar17 < 4) {
        iVar11 = uVar17 * 2;
      }
      if (pvVar2->ptr == (int *)0x0) {
        piVar7 = (int *)malloc((long)iVar11 << 2);
      }
      else {
        piVar7 = (int *)realloc(pvVar2->ptr,(long)iVar11 << 2);
      }
      pvVar2->ptr = piVar7;
      if (piVar7 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)pvVar2->cap * 9.5367431640625e-07,(double)iVar11 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      pvVar2->cap = iVar11;
    }
    iVar11 = pvVar2->size;
    pvVar2->size = iVar11 + 1;
    pvVar2->ptr[iVar11] = uVar10;
  }
  return uVar10;
}

Assistant:

static int clause2_create_new(sat_solver2* s, lit* begin, lit* end, int learnt, int proof_id )
{
    clause* c;
    int h, size = end - begin;
    assert(size < 1 || begin[0] >= 0);
    assert(size < 2 || begin[1] >= 0);
    assert(size < 1 || lit_var(begin[0]) < s->size);
    assert(size < 2 || lit_var(begin[1]) < s->size);
    // create new clause
    h = Sat_MemAppend( &s->Mem, begin, size, learnt, 1 );
    assert( !(h & 1) );
    c = clause2_read( s, h );
    if (learnt)
    {
        if ( s->pPrf1 )
            assert( proof_id );
        c->lbd = sat_clause_compute_lbd( s, c );
        assert( clause_id(c) == veci_size(&s->act_clas) );
        if ( s->pPrf1 || s->pInt2 )
            veci_push(&s->claProofs, proof_id);
//        veci_push(&s->act_clas, (1<<10));
        veci_push(&s->act_clas, 0);
        if ( size > 2 )
            act_clause2_bump( s,c );
        s->stats.learnts++;
        s->stats.learnts_literals += size;
        // remember the last one
        s->hLearntLast = h;
    }
    else
    {
        assert( clause_id(c) == (int)s->stats.clauses );
        s->stats.clauses++;
        s->stats.clauses_literals += size;
    }
    // watch the clause
    if ( size > 1 )
    {
        veci_push(solver2_wlist(s,lit_neg(begin[0])),h);
        veci_push(solver2_wlist(s,lit_neg(begin[1])),h);
    }
    return h;
}